

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsnames.c
# Opt level: O3

FT_Error FT_Get_Sfnt_Name(FT_Face face,FT_UInt idx,FT_SfntName *aname)

{
  undefined8 *puVar1;
  ushort uVar2;
  void *pvVar3;
  FT_Memory pFVar4;
  FT_Stream stream;
  undefined8 uVar5;
  FT_Error FVar6;
  FT_Byte *buffer;
  unsigned_long uVar7;
  FT_UInt FVar8;
  ulong uVar9;
  
  if (face == (FT_Face)0x0 || aname == (FT_SfntName *)0x0) {
    return 6;
  }
  if ((face->face_flags & 8) == 0) {
    return 6;
  }
  if (*(ushort *)&face[2].available_sizes <= idx) {
    return 6;
  }
  pvVar3 = face[2].generic.data;
  puVar1 = (undefined8 *)((long)pvVar3 + (ulong)idx * 0x20);
  uVar2 = *(ushort *)((long)pvVar3 + (ulong)idx * 0x20 + 8);
  uVar9 = (ulong)uVar2;
  FVar8 = (FT_UInt)uVar2;
  if (uVar9 != 0) {
    if (puVar1[3] != 0) goto LAB_00137fa8;
    pFVar4 = face->memory;
    stream = face->stream;
    buffer = (FT_Byte *)(*pFVar4->alloc)(pFVar4,uVar9);
    if (buffer != (FT_Byte *)0x0) {
      memset(buffer,0,uVar9);
      puVar1[3] = buffer;
      uVar9 = puVar1[2];
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        if (uVar9 <= stream->size) goto LAB_00137f6a;
      }
      else {
        uVar7 = (*stream->read)(stream,uVar9,(uchar *)0x0,0);
        buffer = (FT_Byte *)puVar1[3];
        if (uVar7 == 0) {
LAB_00137f6a:
          stream->pos = uVar9;
          FVar6 = FT_Stream_Read(stream,buffer,(ulong)*(ushort *)(puVar1 + 1));
          if (FVar6 == 0) {
            FVar8 = (FT_UInt)*(ushort *)(puVar1 + 1);
            goto LAB_00137fa8;
          }
          buffer = (FT_Byte *)puVar1[3];
        }
        if (buffer == (FT_Byte *)0x0) goto LAB_00137f96;
      }
      (*pFVar4->free)(pFVar4,buffer);
    }
LAB_00137f96:
    puVar1[3] = 0;
    *(undefined2 *)(puVar1 + 1) = 0;
  }
  FVar8 = 0;
LAB_00137fa8:
  uVar5 = *puVar1;
  aname->platform_id = (short)uVar5;
  aname->encoding_id = (short)((ulong)uVar5 >> 0x10);
  aname->language_id = (short)((ulong)uVar5 >> 0x20);
  aname->name_id = (short)((ulong)uVar5 >> 0x30);
  aname->string = (FT_Byte *)puVar1[3];
  aname->string_len = FVar8;
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Sfnt_Name( FT_Face       face,
                    FT_UInt       idx,
                    FT_SfntName  *aname )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );


    if ( aname && face && FT_IS_SFNT( face ) )
    {
      TT_Face  ttface = (TT_Face)face;


      if ( idx < (FT_UInt)ttface->num_names )
      {
        TT_Name  entry = ttface->name_table.names + idx;


        /* load name on demand */
        if ( entry->stringLength > 0 && !entry->string )
        {
          FT_Memory  memory = face->memory;
          FT_Stream  stream = face->stream;


          if ( FT_NEW_ARRAY  ( entry->string, entry->stringLength ) ||
               FT_STREAM_SEEK( entry->stringOffset )                ||
               FT_STREAM_READ( entry->string, entry->stringLength ) )
          {
            FT_FREE( entry->string );
            entry->stringLength = 0;
          }
        }

        aname->platform_id = entry->platformID;
        aname->encoding_id = entry->encodingID;
        aname->language_id = entry->languageID;
        aname->name_id     = entry->nameID;
        aname->string      = (FT_Byte*)entry->string;
        aname->string_len  = entry->stringLength;

        error = FT_Err_Ok;
      }
    }

    return error;
  }